

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
::MatchAndExplain(KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
                  *this,pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *key_value,MatchResultListener *listener)

{
  bool bVar1;
  MatchResultListener *this_00;
  string explanation;
  StringMatchResultListener inner_listener;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  StringMatchResultListener local_1b8;
  
  StringMatchResultListener::StringMatchResultListener(&local_1b8);
  bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::MatchAndExplain(&(this->inner_matcher_).
                             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            ,&key_value->first,&local_1b8.super_MatchResultListener);
  std::__cxx11::stringbuf::str();
  if (bStack_1d8._M_string_length != 0) {
    this_00 = MatchResultListener::operator<<
                        (listener,(char (*) [30])"whose first field is a value ");
    MatchResultListener::operator<<(this_00,&bStack_1d8);
  }
  std::__cxx11::string::~string((string *)&bStack_1d8);
  StringMatchResultListener::~StringMatchResultListener(&local_1b8);
  return bVar1;
}

Assistant:

bool MatchAndExplain(PairType key_value,
                       MatchResultListener* listener) const override {
    StringMatchResultListener inner_listener;
    const bool match = inner_matcher_.MatchAndExplain(
        pair_getters::First(key_value, Rank1()), &inner_listener);
    const std::string explanation = inner_listener.str();
    if (!explanation.empty()) {
      *listener << "whose first field is a value " << explanation;
    }
    return match;
  }